

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

ChMatrix33<double> * __thiscall
chrono::fea::ChElementShellANCF_3833::GetGreenLagrangeStrain
          (ChMatrix33<double> *__return_storage_ptr__,ChElementShellANCF_3833 *this,double xi,
          double eta,double zeta)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ActualDstType actualDst;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  ChMatrix33<double> I3x3;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  Scalar local_688 [9];
  Matrix<double,_3,_3,_0,_3,_3> local_640;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
  local_5c0 [16];
  undefined8 local_5b0;
  Matrix<double,_3,_3,_0,_3,_3> *local_5a8;
  Matrix<double,_3,_3,_0,_3,_3> *local_5a0;
  Scalar *local_598;
  Matrix<double,_3,_3,_1,_3,_3> local_580;
  undefined1 local_500 [16];
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  MatrixNx3c *local_4b0;
  Matrix<double,_3,_3,_1,_3,_3> *local_4a8;
  double local_4a0;
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  Calc_Sxi_D(this,(MatrixNx3c *)local_2c0,xi,eta,zeta,this->m_thicknessZ,this->m_midsurfoffset);
  local_500._0_8_ = 1.0;
  local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_580.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            (&local_580,&this->m_ebar0,(MatrixNx3c *)local_2c0,(Scalar *)local_500);
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_2c0;
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_580;
  local_500._0_8_ = (MatrixNx3c *)local_2c0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_500 + 8),
        (SrcXprType *)
        (local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array + 1),(assign_op<double,_double> *)local_688);
  local_4b0 = (MatrixNx3c *)local_500._0_8_;
  local_4a0 = 1.48219693752374e-323;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_500._8_8_;
  auVar16 = vbroadcastsd_avx512f(auVar7);
  auVar27 = *(undefined1 (*) [64])
             (((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array;
  auVar28 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 8);
  auVar29 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x10);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_4e0;
  auVar17 = vbroadcastsd_avx512f(auVar8);
  auVar1 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x18);
  auVar2 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x20);
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x28);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_4f0;
  auVar18 = vbroadcastsd_avx512f(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_4c8;
  auVar19 = vbroadcastsd_avx512f(auVar10);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x30);
  auVar5 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x38);
  auVar6 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x40);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_4d8;
  auVar20 = vbroadcastsd_avx512f(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_4d0;
  auVar21 = vbroadcastsd_avx512f(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_4c0;
  auVar22 = vbroadcastsd_avx512f(auVar13);
  auVar23 = vmulpd_avx512f(auVar27,auVar16);
  auVar24 = vmulpd_avx512f(auVar16,auVar28);
  auVar16 = vmulpd_avx512f(auVar16,auVar29);
  auVar25 = vmulpd_avx512f(auVar27,auVar18);
  auVar26 = vmulpd_avx512f(auVar28,auVar18);
  auVar23 = vfmadd231pd_avx512f(auVar23,auVar1,auVar17);
  auVar24 = vfmadd231pd_avx512f(auVar24,auVar2,auVar17);
  auVar16 = vfmadd231pd_avx512f(auVar16,auVar3,auVar17);
  auVar17 = vfmadd231pd_avx512f(auVar25,auVar1,auVar20);
  auVar25 = vfmadd231pd_avx512f(auVar26,auVar2,auVar20);
  local_2c0 = vfmadd231pd_avx512f(auVar23,auVar4,auVar19);
  local_280 = vfmadd231pd_avx512f(auVar24,auVar5,auVar19);
  local_240 = vfmadd231pd_avx512f(auVar16,auVar6,auVar19);
  auVar16 = vmulpd_avx512f(auVar29,auVar18);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_4b8;
  auVar18 = vbroadcastsd_avx512f(auVar14);
  local_200 = vfmadd231pd_avx512f(auVar17,auVar4,auVar22);
  local_1c0 = vfmadd231pd_avx512f(auVar25,auVar5,auVar22);
  auVar16 = vfmadd231pd_avx512f(auVar16,auVar3,auVar20);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_4e8;
  auVar17 = vbroadcastsd_avx512f(auVar15);
  local_180 = vfmadd231pd_avx512f(auVar16,auVar6,auVar22);
  auVar27 = vmulpd_avx512f(auVar27,auVar17);
  auVar28 = vmulpd_avx512f(auVar28,auVar17);
  auVar29 = vmulpd_avx512f(auVar29,auVar17);
  auVar27 = vfmadd231pd_avx512f(auVar27,auVar21,auVar1);
  auVar28 = vfmadd231pd_avx512f(auVar28,auVar21,auVar2);
  auVar29 = vfmadd231pd_avx512f(auVar29,auVar3,auVar21);
  local_140 = vfmadd231pd_avx512f(auVar27,auVar18,auVar4);
  local_100 = vfmadd231pd_avx512f(auVar28,auVar18,auVar5);
  local_c0 = vfmadd231pd_avx512f(auVar29,auVar6,auVar18);
  local_4a8 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_500 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_500);
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_640.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_688[0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_640,(Matrix3xN *)local_500,(MatrixNx3c *)local_2c0,local_688);
  local_688[0] = 1.0;
  local_688[3] = 0.0;
  local_688[1] = 0.0;
  local_688[2] = 0.0;
  local_688[4] = 1.0;
  local_688[7] = 0.0;
  local_688[5] = 0.0;
  local_688[6] = 0.0;
  local_688[8] = 1.0;
  local_5b0 = 0x3fe0000000000000;
  local_5a8 = &local_640;
  local_5a0 = &local_640;
  local_598 = local_688;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (__return_storage_ptr__,local_5c0);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementShellANCF_3833::GetGreenLagrangeStrain(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta, m_thicknessZ, m_midsurfoffset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    ChMatrix33<> I3x3;
    I3x3.setIdentity();
    return 0.5 * (F.transpose() * F - I3x3);
}